

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

bool loadNpfTexture(void)

{
  PFNGLTEXSUBIMAGE2DPROC p_Var1;
  GLboolean GVar2;
  GLenum GVar3;
  reference pvVar4;
  size_type __n;
  undefined1 local_30 [8];
  vector<float,_std::allocator<float>_> data;
  FILE *pf;
  
  fprintf(_stdout,"Loading {NPF-Texture}\n");
  fflush(_stdout);
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)fopen(g_sphere.shading.pathToUberData,"rb");
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  if (data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage == (pointer)0x0) {
    pf._7_1_ = false;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_30,0x60000);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_30,0);
    __n = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_30);
    fread(pvVar4,4,__n,
          (FILE *)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    fclose((FILE *)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    GVar2 = (*glad_glIsTexture)(g_gl.textures[4]);
    if (GVar2 != '\0') {
      (*glad_glDeleteTextures)(1,g_gl.textures + 4);
    }
    (*glad_glGenTextures)(1,g_gl.textures + 4);
    (*glad_glActiveTexture)(0x84c4);
    (*glad_glBindTexture)(0xde1,g_gl.textures[4]);
    (*glad_glTexStorage2D)(0xde1,1,0x8815,0x200,0x100);
    p_Var1 = glad_glTexSubImage2D;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_30,0);
    (*p_Var1)(0xde1,0,0,0,0x200,0x100,0x1907,0x1406,pvVar4);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glActiveTexture)(0x84c0);
    GVar3 = (*glad_glGetError)();
    pf._7_1_ = GVar3 == 0;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return pf._7_1_;
}

Assistant:

bool loadNpfTexture()
{
    LOG("Loading {NPF-Texture}\n");
    FILE *pf = fopen(g_sphere.shading.pathToUberData, "rb");
    std::vector<float> data;

    if (!pf)
        return false;
    data.resize(512 * 256 * 3);
    fread(&data[0], sizeof(float), data.size(), pf);
    fclose(pf);
    if (glIsTexture(g_gl.textures[TEXTURE_NPF]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_NPF]);
    glGenTextures(1, &g_gl.textures[TEXTURE_NPF]);

    glActiveTexture(GL_TEXTURE0 + TEXTURE_NPF);
    glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_NPF]);
    glTexStorage2D(GL_TEXTURE_2D,
                   1,
                   GL_RGB32F,
                   512,
                   256);
    glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 512, 256, GL_RGB, GL_FLOAT, &data[0]);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glActiveTexture(GL_TEXTURE0);

    return (glGetError() == GL_NO_ERROR);
}